

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.cc
# Opt level: O0

void avl_set_bf(avl_node *node,int bf)

{
  int bf_local;
  avl_node *node_local;
  
  node->parent = (avl_node *)((ulong)node->parent & 0xfffffffffffffffc | (long)(bf + 1));
  return;
}

Assistant:

INLINE void avl_set_bf(struct avl_node *node, int bf)
{
    __AVL_DEBUG_BF_CHECK(bf);

#ifdef _AVL_SEPARATE_PARENT_BF
    node->bf = bf;
#else
    node->parent = (struct avl_node *)(
        (uint64_t)avl_parent(node) | (uint64_t)(bf+1));
#endif
}